

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

JBTIndex __thiscall
anon_unknown.dwarf_1365de8::BacktraceData::Add(BacktraceData *this,cmListFileBacktrace *bt)

{
  cmListFileContext *value;
  bool bVar1;
  JBTIndex value_00;
  ArrayIndex AVar2;
  iterator iVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Var4;
  Value *pVVar5;
  mapped_type *pmVar6;
  string *__k;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar7;
  cmListFileContext *top;
  Value *local_d8;
  undefined1 local_d0 [44];
  ArrayIndex fileIndex;
  Value entry;
  ArrayIndex cmdIndex;
  Value local_58;
  
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  if (bVar1) {
    AVar2 = 0xffffffff;
  }
  else {
    top = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                    (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    iVar3 = std::
            _Hashtable<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->NodeMap)._M_h,&top);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      Json::Value::Value(&entry,objectValue);
      __k = &top->FilePath;
      _Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(this->FileMap)._M_h,__k);
      if (_Var4._M_cur == (__node_type *)0x0) {
        local_d8 = &this->Files;
        fileIndex = Json::Value::size(local_d8);
        pVar7 = std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&this->FileMap,__k);
        _Var4._M_cur = (__node_type *)
                       pVar7.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                       ._M_cur;
        cmSystemTools::RelativeIfUnder((string *)&cmdIndex,&this->TopSource,__k);
        Json::Value::Value((Value *)local_d0,(String *)&cmdIndex);
        Json::Value::append(local_d8,(Value *)local_d0);
        Json::Value::~Value((Value *)local_d0);
        std::__cxx11::string::~string((string *)&cmdIndex);
      }
      Json::Value::Value(&local_58,
                         *(UInt *)((long)&((_Var4._M_cur)->
                                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                          ._M_storage._M_storage + 0x20));
      pVVar5 = Json::Value::operator[](&entry,"file");
      Json::Value::operator=(pVVar5,&local_58);
      Json::Value::~Value(&local_58);
      if (top->Line != 0) {
        Json::Value::Value((Value *)local_d0,(Int)top->Line);
        pVVar5 = Json::Value::operator[](&entry,"line");
        Json::Value::operator=(pVVar5,(Value *)local_d0);
        Json::Value::~Value((Value *)local_d0);
      }
      value = top;
      if ((top->Name)._M_string_length != 0) {
        _Var4._M_cur = (__node_type *)
                       std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(this->CommandMap)._M_h,&top->Name);
        if (_Var4._M_cur == (__node_type *)0x0) {
          local_d8 = &this->Commands;
          cmdIndex = Json::Value::size(local_d8);
          pVar7 = std::
                  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                              *)&this->CommandMap,value);
          _Var4._M_cur = (__node_type *)
                         pVar7.first.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                         ._M_cur;
          Json::Value::Value((Value *)local_d0,&value->Name);
          Json::Value::append(local_d8,(Value *)local_d0);
          Json::Value::~Value((Value *)local_d0);
        }
        Json::Value::Value(&local_58,
                           *(UInt *)((long)&((_Var4._M_cur)->
                                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                            ._M_storage._M_storage + 0x20));
        pVVar5 = Json::Value::operator[](&entry,"command");
        Json::Value::operator=(pVVar5,&local_58);
        Json::Value::~Value(&local_58);
      }
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_d0);
      value_00 = Add(this,(cmListFileBacktrace *)local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
      if (value_00.Index != 0xffffffff) {
        Json::Value::Value((Value *)local_d0,value_00.Index);
        pVVar5 = Json::Value::operator[](&entry,"parent");
        Json::Value::operator=(pVVar5,(Value *)local_d0);
        Json::Value::~Value((Value *)local_d0);
      }
      AVar2 = Json::Value::size(&this->Nodes);
      pmVar6 = std::__detail::
               _Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->NodeMap,&top);
      *pmVar6 = AVar2;
      Json::Value::append(&this->Nodes,&entry);
      Json::Value::~Value(&entry);
    }
    else {
      AVar2 = *(ArrayIndex *)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_cmListFileContext_*const,_unsigned_int>,_false>
                      ._M_cur + 0x10);
    }
  }
  return (JBTIndex)AVar2;
}

Assistant:

JBTIndex BacktraceData::Add(cmListFileBacktrace const& bt)
{
  JBTIndex index;
  if (bt.Empty()) {
    return index;
  }
  cmListFileContext const* top = &bt.Top();
  auto found = this->NodeMap.find(top);
  if (found != this->NodeMap.end()) {
    index.Index = found->second;
    return index;
  }
  Json::Value entry = Json::objectValue;
  entry["file"] = this->AddFile(top->FilePath);
  if (top->Line) {
    entry["line"] = static_cast<int>(top->Line);
  }
  if (!top->Name.empty()) {
    entry["command"] = this->AddCommand(top->Name);
  }
  if (JBTIndex parent = this->Add(bt.Pop())) {
    entry["parent"] = parent.Index;
  }
  index.Index = this->NodeMap[top] = this->Nodes.size();
  this->Nodes.append(std::move(entry)); // NOLINT(*)
  return index;
}